

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void zng_tr_flush_block(deflate_state *s,char *buf,uint32_t stored_len,int last)

{
  int iVar1;
  deflate_state *s_00;
  int in_ECX;
  int in_EDX;
  deflate_state *in_RSI;
  deflate_state *in_RDI;
  deflate_state *unaff_retaddr;
  int max_blindex;
  unsigned_long static_lenb;
  unsigned_long opt_lenb;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  deflate_state *ltree;
  
  iVar2 = 0;
  if (in_RDI->sym_next == 0) {
    ltree = (deflate_state *)0x0;
    in_RDI->static_len = 7;
    s_00 = (deflate_state *)0x0;
  }
  else if (in_RDI->level < 1) {
    ltree = (deflate_state *)(ulong)(in_EDX + 5);
    s_00 = ltree;
  }
  else {
    if (in_RDI->strm->data_type == 2) {
      iVar1 = detect_data_type(in_RDI);
      in_RDI->strm->data_type = iVar1;
    }
    build_tree(unaff_retaddr,(tree_desc *)in_RDI);
    build_tree(unaff_retaddr,(tree_desc *)in_RDI);
    iVar2 = build_bl_tree((deflate_state *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    s_00 = (deflate_state *)(in_RDI->opt_len + 10 >> 3);
    ltree = (deflate_state *)(in_RDI->static_len + 10 >> 3);
    if ((ltree <= s_00) || (in_RDI->strategy == 4)) {
      s_00 = ltree;
    }
  }
  if ((s_00 < (deflate_state *)(ulong)(in_EDX + 4)) || (in_RSI == (deflate_state *)0x0)) {
    if (ltree == s_00) {
      zng_tr_emit_tree(in_RSI,in_EDX,in_ECX);
      compress_block(s_00,(ct_data *)ltree,(ct_data *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    }
    else {
      zng_tr_emit_tree(in_RSI,in_EDX,in_ECX);
      send_all_trees((deflate_state *)CONCAT44(stored_len,last),opt_lenb._4_4_,(int)opt_lenb,
                     static_lenb._4_4_);
      compress_block(s_00,(ct_data *)ltree,(ct_data *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    }
  }
  else {
    zng_tr_stored_block((deflate_state *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8,0,0x114c2a);
  }
  init_block(in_RDI);
  if (in_ECX != 0) {
    zng_tr_emit_align((deflate_state *)0x114ce7);
  }
  return;
}

Assistant:

void Z_INTERNAL zng_tr_flush_block(deflate_state *s, char *buf, uint32_t stored_len, int last) {
    /* buf: input block, or NULL if too old */
    /* stored_len: length of input block */
    /* last: one if this is the last block for a file */
    unsigned long opt_lenb, static_lenb; /* opt_len and static_len in bytes */
    int max_blindex = 0;  /* index of last bit length code of non zero freq */

    /* Build the Huffman trees unless a stored block is forced */
    if (UNLIKELY(s->sym_next == 0)) {
        /* Emit an empty static tree block with no codes */
        opt_lenb = static_lenb = 0;
        s->static_len = 7;
    } else if (s->level > 0) {
        /* Check if the file is binary or text */
        if (s->strm->data_type == Z_UNKNOWN)
            s->strm->data_type = detect_data_type(s);

        /* Construct the literal and distance trees */
        build_tree(s, (tree_desc *)(&(s->l_desc)));
        Tracev((stderr, "\nlit data: dyn %lu, stat %lu", s->opt_len, s->static_len));

        build_tree(s, (tree_desc *)(&(s->d_desc)));
        Tracev((stderr, "\ndist data: dyn %lu, stat %lu", s->opt_len, s->static_len));
        /* At this point, opt_len and static_len are the total bit lengths of
         * the compressed block data, excluding the tree representations.
         */

        /* Build the bit length tree for the above two trees, and get the index
         * in bl_order of the last bit length code to send.
         */
        max_blindex = build_bl_tree(s);

        /* Determine the best encoding. Compute the block lengths in bytes. */
        opt_lenb = (s->opt_len+3+7) >> 3;
        static_lenb = (s->static_len+3+7) >> 3;

        Tracev((stderr, "\nopt %lu(%lu) stat %lu(%lu) stored %u lit %u ",
                opt_lenb, s->opt_len, static_lenb, s->static_len, stored_len,
                s->sym_next / 3));

        if (static_lenb <= opt_lenb || s->strategy == Z_FIXED)
            opt_lenb = static_lenb;

    } else {
        Assert(buf != NULL, "lost buf");
        opt_lenb = static_lenb = stored_len + 5; /* force a stored block */
    }

    if (stored_len+4 <= opt_lenb && buf != NULL) {
        /* 4: two words for the lengths
         * The test buf != NULL is only necessary if LIT_BUFSIZE > WSIZE.
         * Otherwise we can't have processed more than WSIZE input bytes since
         * the last block flush, because compression would have been
         * successful. If LIT_BUFSIZE <= WSIZE, it is never too late to
         * transform a block into a stored block.
         */
        zng_tr_stored_block(s, buf, stored_len, last);

    } else if (static_lenb == opt_lenb) {
        zng_tr_emit_tree(s, STATIC_TREES, last);
        compress_block(s, (const ct_data *)static_ltree, (const ct_data *)static_dtree);
        cmpr_bits_add(s, s->static_len);
    } else {
        zng_tr_emit_tree(s, DYN_TREES, last);
        send_all_trees(s, s->l_desc.max_code+1, s->d_desc.max_code+1, max_blindex+1);
        compress_block(s, (const ct_data *)s->dyn_ltree, (const ct_data *)s->dyn_dtree);
        cmpr_bits_add(s, s->opt_len);
    }
    Assert(s->compressed_len == s->bits_sent, "bad compressed size");
    /* The above check is made mod 2^32, for files larger than 512 MB
     * and unsigned long implemented on 32 bits.
     */
    init_block(s);

    if (last) {
        zng_tr_emit_align(s);
    }
    Tracev((stderr, "\ncomprlen %lu(%lu) ", s->compressed_len>>3, s->compressed_len-7*last));
}